

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O0

void TRM::LinkedList<TRM::Vertex>::Remove<&TRM::Vertex::prev,&TRM::Vertex::next>
               (Vertex *t,Vertex **head,Vertex **tail)

{
  Vertex **tail_local;
  Vertex **head_local;
  Vertex *t_local;
  
  if (*(long *)(t + 8) == 0) {
    if (head != (Vertex **)0x0) {
      *head = *(Vertex **)(t + 0x10);
    }
  }
  else {
    *(undefined8 *)(*(long *)(t + 8) + 0x10) = *(undefined8 *)(t + 0x10);
  }
  if (*(long *)(t + 0x10) == 0) {
    if (tail != (Vertex **)0x0) {
      *tail = *(Vertex **)(t + 8);
    }
  }
  else {
    *(undefined8 *)(*(long *)(t + 0x10) + 8) = *(undefined8 *)(t + 8);
  }
  *(undefined8 *)(t + 0x10) = 0;
  *(undefined8 *)(t + 8) = 0;
  return;
}

Assistant:

static void Remove(T* t, T** head, T** tail) {
    if (t->*Prev) {
      t->*Prev->*Next = t->*Next;
    } else if (head) {
      *head = t->*Next;
    }

    if (t->*Next) {
      t->*Next->*Prev = t->*Prev;
    } else if (tail) {
      *tail = t->*Prev;
    }

    t->*Prev = t->*Next = nullptr;
  }